

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

wchar_t map_get_editor(EditLine *el,wchar_t **editor)

{
  wchar_t wVar1;
  wchar_t **editor_local;
  EditLine *el_local;
  
  if (editor == (wchar_t **)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    wVar1 = (el->el_map).type;
    if (wVar1 == L'\0') {
      *editor = anon_var_dwarf_14905;
      el_local._4_4_ = L'\0';
    }
    else if (wVar1 == L'\x01') {
      *editor = anon_var_dwarf_14f7d + 0x1a;
      el_local._4_4_ = L'\0';
    }
    else {
      el_local._4_4_ = L'\xffffffff';
    }
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
map_get_editor(EditLine *el, const wchar_t **editor)
{

	if (editor == NULL)
		return -1;
	switch (el->el_map.type) {
	case MAP_EMACS:
		*editor = L"emacs";
		return 0;
	case MAP_VI:
		*editor = L"vi";
		return 0;
	}
	return -1;
}